

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9_count_char_in_string.cpp
# Opt level: O2

int count_char(char *str,char ch)

{
  if (*str != '\0') {
    std::operator<<((ostream *)&std::cout,"===>");
  }
  return 0;
}

Assistant:

int count_char(const char * str, char ch)
{
    int count = 0;
    //  *str 是地址处的字符
    while(*str) {
        std::cout << "===>" << *str << std::endl;
        if (*str == ch) {
            count++;
        }
        //  地址+1，指向下一个字符
        str++;
    }
    return count;
}